

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

uint32_t readUINT32(ifstream *stream)

{
  char *buff;
  ifstream *piStack_10;
  uint32_t value;
  ifstream *stream_local;
  
  piStack_10 = stream;
  std::istream::read((char *)stream,(long)&buff + 4);
  std::reverse<char*>((char *)((long)&buff + 4),(char *)&stack0xfffffffffffffff0);
  return buff._4_4_;
}

Assistant:

uint32_t readUINT32(std::ifstream& stream)
{
    uint32_t value;
    char * buff = reinterpret_cast<char *>(&value);
    stream.read(buff, 4);
    std::reverse(buff, buff + 4);
    return value;
}